

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tape.cpp
# Opt level: O3

void __thiscall
MercuryJson::Tape::_thread_parse_num
          (Tape *this,size_t pid,char *input,size_t *idx_ptr,size_t structural_size)

{
  return;
}

Assistant:

void Tape::_thread_parse_num(size_t pid, char *input, const size_t *idx_ptr, size_t structural_size) {
#if PARSE_NUM_NUM_THREADS
        size_t begin = pid * structural_size / PARSE_NUM_NUM_THREADS;
        size_t end = (pid + 1) * structural_size / PARSE_NUM_NUM_THREADS;
        for (size_t numeric_idx = begin; numeric_idx < end; ++numeric_idx) {
            size_t offset = idx_ptr[numeric_idx];
            if (!(input[offset] == '-' || (input[offset] >= '0' && input[offset] <= '9'))) continue;
            size_t tape_idx = numeric[numeric_idx];
            __parse_and_write_number(input, offset, tape_idx, numeric_idx);
        }
#endif
    }